

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> * __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode>::operator=
          (ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *this,
          ArrayBuilder<capnp::compiler::NodeTranslator::AuxNode> *other)

{
  AuxNode *pAVar1;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar2;
  AuxNode *pAVar3;
  ArrayDisposer *pAVar4;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (AuxNode *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (AuxNode *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
    this->endPtr = (AuxNode *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pAVar1,0x40,(long)pRVar2 - (long)pAVar1 >> 6,
               (long)pAVar3 - (long)pAVar1 >> 6,
               ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::AuxNode,_false>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (AuxNode *)0x0;
  other->pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
  other->endPtr = (AuxNode *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }